

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

uint __thiscall ON_PointCloud::SizeOf(ON_PointCloud *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = ON_Object::SizeOf((ON_Object *)this);
  uVar3 = (ulong)(uint)(this->m_H).m_capacity +
          (ulong)(uint)((this->m_V).m_capacity << 3) +
          (ulong)(uint)((this->m_C).m_capacity << 2) + (ulong)(uint)((this->m_N).m_capacity * 0x18)
          + (ulong)(uint)((this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_capacity * 0x18) +
            (ulong)uVar1 + 0x138;
  uVar2 = 0xffff0000;
  if (uVar3 < 0xffff0000) {
    uVar2 = uVar3;
  }
  return (uint)uVar2;
}

Assistant:

unsigned int ON_PointCloud::SizeOf() const
{
  // Dale Lear fixed this function in April 2021.
  // Before that all point clouds were reported to have 
  // ON_Geometry::SizeOf() bytes.

  size_t sz = ON_Geometry::SizeOf();

  sz += (sizeof(*this) - sizeof(ON_Geometry));
  sz += (size_t)(m_P.SizeOfArray());
  sz += (size_t)(m_N.SizeOfArray());
  sz += (size_t)(m_C.SizeOfArray());
  sz += (size_t)(m_V.SizeOfArray());
  sz += (size_t)(m_H.SizeOfArray());

  // Avoid overflowing 4 byte unsigned int
  // and hope the consumer of this information is 
  // converting back to size_t before doing arithmetic.
  // The low 4 bytes are zeroed so small additions won't
  // overflow unsigned int.
  return (sz > 0xFFFF0000U) ? 0xFFFF0000U : ((unsigned int)sz);
}